

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_file.c
# Opt level: O2

_Bool internal_file_exists(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  _Bool _Var1;
  gravity_fiber_t *fiber;
  undefined6 in_register_00000012;
  gravity_value_t value;
  gravity_value_t value_00;
  char _buffer [4096];
  char local_1018 [4096];
  
  if (((int)CONCAT62(in_register_00000012,nargs) == 2) || (args[1].isa == gravity_class_string)) {
    _Var1 = file_exists((char *)(args[1].field_1.p)->objclass);
    value_00.field_1.n._0_1_ = _Var1;
    value_00.isa = gravity_class_bool;
    value_00.field_1.n._1_7_ = 0;
    gravity_vm_setslot(vm,value_00,rindex);
    _Var1 = true;
  }
  else {
    builtin_strncpy(local_1018 + 0x20,"is required.",0xd);
    builtin_strncpy(local_1018 + 0x10," of type String ",0x10);
    builtin_strncpy(local_1018,"A path parameter",0x10);
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1018);
    _Var1 = false;
    value.field_1.n = 0;
    value.isa = gravity_class_null;
    gravity_vm_setslot(vm,value,rindex);
  }
  return _Var1;
}

Assistant:

static bool internal_file_exists (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    // 1 parameter of type string is required
    if (nargs != 2 && !VALUE_ISA_STRING(args[1])) {
        RETURN_ERROR("A path parameter of type String is required.");
    }
    
    char *path = VALUE_AS_STRING(args[1])->s;
    bool exists = file_exists((const char *)path);
    RETURN_VALUE(VALUE_FROM_BOOL(exists), rindex);
}